

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

state_status_t __thiscall
tchecker::zg::elapsed_semantics_t::initial
          (elapsed_semantics_t *this,db_t *dbm,clock_id_t dim,bool delay_allowed,
          clock_constraint_container_t *invariant)

{
  status_t sVar1;
  clock_constraint_container_t *invariant_local;
  bool delay_allowed_local;
  clock_id_t dim_local;
  db_t *dbm_local;
  elapsed_semantics_t *this_local;
  
  tchecker::dbm::zero(dbm,dim);
  sVar1 = tchecker::dbm::constrain(dbm,dim,invariant);
  if (sVar1 == EMPTY) {
    this_local._4_4_ = 0x80;
  }
  else {
    if (delay_allowed) {
      tchecker::dbm::open_up(dbm,dim);
      sVar1 = tchecker::dbm::constrain(dbm,dim,invariant);
      if (sVar1 == EMPTY) {
        return 0x80;
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

tchecker::state_status_t elapsed_semantics_t::initial(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, bool delay_allowed,
                                                      tchecker::clock_constraint_container_t const & invariant)
{
  tchecker::dbm::zero(dbm, dim);

  if (tchecker::dbm::constrain(dbm, dim, invariant) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;

  if (delay_allowed) {
    tchecker::dbm::open_up(dbm, dim);

    if (tchecker::dbm::constrain(dbm, dim, invariant) == tchecker::dbm::EMPTY)
      return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;
  }

  return tchecker::STATE_OK;
}